

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O2

void bmcg_sat_solver_var_set_frozen(bmcg_sat_solver *s,int v,int freeze)

{
  Gluco::SimpSolver::setFrozen((SimpSolver *)s,v,freeze != 0);
  return;
}

Assistant:

void bmcg_sat_solver_var_set_frozen( bmcg_sat_solver* s, int v, int freeze )
{
    ((Gluco::SimpSolver*)s)->setFrozen(v, freeze != 0);
}